

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void __thiscall FConsoleCommand::~FConsoleCommand(FConsoleCommand *this)

{
  ~FConsoleCommand(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

FConsoleCommand::~FConsoleCommand ()
{
	*m_Prev = m_Next;
	if (m_Next)
		m_Next->m_Prev = m_Prev;
	C_RemoveTabCommand (m_Name);
	delete[] m_Name;
}